

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * __thiscall
QUtil::int_to_string_base_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,longlong num,int base,int length)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  logic_error *this_00;
  QUtil *pQVar4;
  type ii;
  uint uVar5;
  int iVar6;
  int iVar7;
  QUtil *__val;
  string cvt;
  ostringstream buf;
  undefined1 *local_1f0;
  ulong local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  locale local_1d0 [8];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  uVar5 = (uint)num;
  if ((0x10 < uVar5) || ((0x10500U >> (uVar5 & 0x1f) & 1) == 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"int_to_string_base called with unsupported base");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  if (uVar5 == 10) {
    __val = (QUtil *)-(long)this;
    if (0 < (long)this) {
      __val = this;
    }
    uVar5 = 1;
    if ((QUtil *)0x9 < __val) {
      pQVar4 = __val;
      uVar3 = 4;
      do {
        uVar5 = uVar3;
        if (pQVar4 < (QUtil *)0x64) {
          uVar5 = uVar5 - 2;
          goto LAB_00242644;
        }
        if (pQVar4 < (QUtil *)0x3e8) {
          uVar5 = uVar5 - 1;
          goto LAB_00242644;
        }
        if (pQVar4 < (QUtil *)0x2710) goto LAB_00242644;
        bVar1 = (QUtil *)0x1869f < pQVar4;
        pQVar4 = (QUtil *)((ulong)pQVar4 / 10000);
        uVar3 = uVar5 + 4;
      } while (bVar1);
      uVar5 = uVar5 + 1;
    }
LAB_00242644:
    local_1a8[0] = &local_198;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar5 - (char)((long)this >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_1a8[0] - ((long)this >> 0x3f)),uVar5,(unsigned_long_long)__val);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1a8);
    if (local_1a8[0] != &local_198) {
      operator_delete(local_1a8[0],local_198 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::locale::classic();
    std::ios::imbue(local_1d0);
    std::locale::~locale(local_1d0);
    if (uVar5 == 8) {
      uVar5 = 0x40;
    }
    else if (uVar5 == 10) {
      uVar5 = 2;
    }
    else {
      uVar5 = (uint)(uVar5 == 0x10) << 3;
    }
    *(uint *)((long)auStack_190 + local_1a8[0][-3]) =
         *(uint *)((long)auStack_190 + local_1a8[0][-3]) & 0xffffffb5 | uVar5;
    *(uint *)((long)auStack_190 + local_1a8[0][-3]) =
         *(uint *)((long)auStack_190 + local_1a8[0][-3]) & 0xffffbfff;
    std::ostream::_M_insert<long_long>((longlong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  uVar2 = local_1e8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((local_1e8 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_1e8);
  }
  iVar6 = (int)uVar2;
  if (iVar6 < base && 0 < base) {
    iVar7 = base - iVar6;
    if (iVar7 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar7);
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,(char)iVar7)
    ;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1f0);
  if (base < 0) {
    iVar7 = -base - iVar6;
    if (iVar7 != 0 && iVar6 <= -base) {
      if (iVar7 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar7);
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 (char)iVar7);
    }
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
int_to_string_base_internal(T num, int base, int length)
{
    // Backward compatibility -- int_to_string, which calls this function, used to use sprintf with
    // %0*d, so we interpret length such that a negative value appends spaces and a positive value
    // prepends zeroes.
    if (!((base == 8) || (base == 10) || (base == 16))) {
        throw std::logic_error("int_to_string_base called with unsupported base");
    }
    std::string cvt;
    if (base == 10) {
        // Use the more efficient std::to_string when possible
        cvt = std::to_string(num);
    } else {
        std::ostringstream buf;
        buf.imbue(std::locale::classic());
        buf << std::setbase(base) << std::nouppercase << num;
        cvt = buf.str();
    }
    std::string result;
    int str_length = QIntC::to_int(cvt.length());
    if ((length > 0) && (str_length < length)) {
        result.append(QIntC::to_size(length - str_length), '0');
    }
    result += cvt;
    if ((length < 0) && (str_length < -length)) {
        result.append(QIntC::to_size(-length - str_length), ' ');
    }
    return result;
}